

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFBStreamTest.cpp
# Opt level: O2

int PFBStreamTest(int argc,char **argv)

{
  EStatusCode EVar1;
  IByteReader *inStreamToDecode;
  IByteWriter *inOutputStream;
  uint uVar2;
  allocator<char> local_132;
  allocator<char> local_131;
  OutputStreamTraits traits;
  string local_110;
  string local_f0;
  string local_d0;
  OutputFile decodedPFBFile;
  InputFile pfbFile;
  InputPFBDecodeStream decodeStream;
  
  InputFile::InputFile(&pfbFile);
  OutputFile::OutputFile(&decodedPFBFile);
  InputPFBDecodeStream::InputPFBDecodeStream(&decodeStream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"fonts/HLB_____.PFB",&local_132);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,argv[1],&local_131);
  LocalPathToFileURL((FileURL *)&traits,&local_d0);
  RelativeURLToLocalPath(&local_f0,(FileURL *)&traits,&local_110);
  FileURL::~FileURL((FileURL *)&traits);
  std::__cxx11::string::~string((string *)&local_d0);
  InputFile::OpenFile(&pfbFile,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"decodedPFBFile.txt",&local_132);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,argv[2],&local_131);
  LocalPathToFileURL((FileURL *)&traits,&local_d0);
  RelativeURLToLocalPath(&local_f0,(FileURL *)&traits,&local_110);
  FileURL::~FileURL((FileURL *)&traits);
  std::__cxx11::string::~string((string *)&local_d0);
  OutputFile::OpenFile(&decodedPFBFile,&local_f0,false);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  inStreamToDecode = &InputFile::GetInputStream(&pfbFile)->super_IByteReader;
  EVar1 = InputPFBDecodeStream::Assign(&decodeStream,inStreamToDecode);
  if (EVar1 == eSuccess) {
    inOutputStream = &OutputFile::GetOutputStream(&decodedPFBFile)->super_IByteWriter;
    OutputStreamTraits::OutputStreamTraits(&traits,inOutputStream);
    EVar1 = OutputStreamTraits::CopyToOutputStream(&traits,&decodeStream.super_IByteReader);
    if (EVar1 != eSuccess) {
      std::operator<<((ostream *)&std::cout,"Failed to decode pfb stream");
    }
    OutputStreamTraits::~OutputStreamTraits(&traits);
    uVar2 = (uint)(EVar1 != eSuccess);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Failed to assign pfb input stream");
    uVar2 = 1;
  }
  InputPFBDecodeStream::Assign(&decodeStream,(IByteReader *)0x0);
  InputFile::CloseFile(&pfbFile);
  OutputFile::CloseFile(&decodedPFBFile);
  InputPFBDecodeStream::~InputPFBDecodeStream(&decodeStream);
  OutputFile::~OutputFile(&decodedPFBFile);
  InputFile::~InputFile(&pfbFile);
  return uVar2;
}

Assistant:

int PFBStreamTest(int argc, char* argv[])
{
	EStatusCode status;
	InputFile pfbFile;
	OutputFile decodedPFBFile;
	InputPFBDecodeStream decodeStream;

	do
	{
		pfbFile.OpenFile(BuildRelativeInputPath(argv,"fonts/HLB_____.PFB"));

		decodedPFBFile.OpenFile(BuildRelativeOutputPath(argv,"decodedPFBFile.txt"));


		status = decodeStream.Assign(pfbFile.GetInputStream());
		
		if(status != PDFHummus::eSuccess)
		{
			cout<<"Failed to assign pfb input stream";
			break;
		}

		OutputStreamTraits traits(decodedPFBFile.GetOutputStream());

		status = traits.CopyToOutputStream(&decodeStream);

		if(status != PDFHummus::eSuccess)
		{
			cout<<"Failed to decode pfb stream";
			break;
		}
	}while(false);

	decodeStream.Assign(NULL);
	pfbFile.CloseFile();
	decodedPFBFile.CloseFile();

	return status == eSuccess ? 0:1;
}